

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

MatchProperties __thiscall cmFileCopier::CollectMatchProperties(cmFileCopier *this,char *file)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  pointer this_00;
  uint uVar4;
  allocator local_51;
  string local_50;
  
  bVar3 = 0;
  uVar4 = 0;
  bVar2 = false;
  for (this_00 = (this->MatchRules).
                 super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      (this->MatchRules).
      super__Vector_base<cmFileCopier::MatchRule,_std::allocator<cmFileCopier::MatchRule>_>._M_impl.
      super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
    bVar1 = cmsys::RegularExpression::find(&this_00->Regex,file);
    if (bVar1) {
      bVar3 = bVar3 | (this_00->Properties).Exclude;
      uVar4 = uVar4 | (this_00->Properties).Permissions;
      bVar2 = true;
    }
  }
  if ((!bVar2) && (this->MatchlessFiles == false)) {
    std::__cxx11::string::string((string *)&local_50,file,&local_51);
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_50);
    bVar3 = !bVar2;
    std::__cxx11::string::~string((string *)&local_50);
  }
  return (MatchProperties)((ulong)bVar3 | (ulong)uVar4 << 0x20);
}

Assistant:

MatchProperties CollectMatchProperties(const char* file)
  {
// Match rules are case-insensitive on some platforms.
#if defined(_WIN32) || defined(__APPLE__) || defined(__CYGWIN__)
    std::string lower = cmSystemTools::LowerCase(file);
    const char* file_to_match = lower.c_str();
#else
    const char* file_to_match = file;
#endif

    // Collect properties from all matching rules.
    bool matched = false;
    MatchProperties result;
    for (std::vector<MatchRule>::iterator mr = this->MatchRules.begin();
         mr != this->MatchRules.end(); ++mr) {
      if (mr->Regex.find(file_to_match)) {
        matched = true;
        result.Exclude |= mr->Properties.Exclude;
        result.Permissions |= mr->Properties.Permissions;
      }
    }
    if (!matched && !this->MatchlessFiles) {
      result.Exclude = !cmSystemTools::FileIsDirectory(file);
    }
    return result;
  }